

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_billboard_rec
               (rf_camera3d camera,rf_texture2d texture,rf_rec source_rec,rf_vec3 center,float size,
               rf_color tint)

{
  int iVar1;
  rf_render_batch *prVar2;
  long lVar3;
  rf_vertex_buffer *prVar4;
  rf_gfx_texcoord_data_type *prVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  rf_mat mat_view;
  float local_118;
  float fStack_114;
  float local_108;
  float fStack_104;
  float local_f8;
  float fStack_f4;
  rf_mat local_68;
  
  fVar11 = center.z;
  rf_mat_look_at(&local_68,camera.position,camera.target,camera.up);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  if (prVar4[lVar3].elements_count * 4 <= prVar4[lVar3].v_counter + 4) {
    rf_gfx_draw();
  }
  fVar6 = size * 0.5;
  local_f8 = source_rec.width;
  fStack_f4 = source_rec.height;
  fVar14 = ((size * fStack_f4) / local_f8) * 0.5;
  fVar8 = fVar14 * 0.0;
  fVar9 = fVar8 + local_68.m8 * fVar6;
  local_108 = center.x;
  fStack_104 = center.y;
  fVar12 = fVar14 + local_68.m4 * fVar6;
  fVar13 = fVar8 + fVar6 * local_68.m0;
  fVar14 = local_68.m4 * fVar6 - fVar14;
  fVar15 = local_68.m8 * fVar6 - fVar8;
  fVar8 = fVar6 * local_68.m0 - fVar8;
  rf_gfx_enable_texture(texture.id);
  rf_gfx_begin(RF_QUADS);
  rf_gfx_color4ub(tint.r,tint.g,tint.b,tint.a);
  local_118 = source_rec.x;
  fStack_114 = source_rec.y;
  fVar10 = local_118 / (float)texture.width;
  fVar6 = fStack_114 / (float)texture.height;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar10;
  prVar5[iVar1 * 2 + 1] = fVar6;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(local_108 - fVar8,fStack_104 - fVar14,fVar11 - fVar15);
  fVar7 = (fStack_114 + fStack_f4) / (float)texture.height;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar10;
  prVar5[iVar1 * 2 + 1] = fVar7;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(local_108 - fVar13,fStack_104 - fVar12,fVar11 - fVar9);
  fVar10 = (local_118 + local_f8) / (float)texture.width;
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar10;
  prVar5[iVar1 * 2 + 1] = fVar7;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(local_108 + fVar8,fStack_104 + fVar14,fVar15 + fVar11);
  prVar2 = (rf__ctx->field_0).current_batch;
  lVar3 = prVar2->current_buffer;
  prVar4 = prVar2->vertex_buffers;
  prVar5 = prVar4[lVar3].texcoords;
  iVar1 = prVar4[lVar3].tc_counter;
  prVar5[(long)iVar1 * 2] = fVar10;
  prVar5[iVar1 * 2 + 1] = fVar6;
  prVar4[lVar3].tc_counter = prVar4[lVar3].tc_counter + 1;
  rf_gfx_vertex3f(fVar13 + local_108,fVar12 + fStack_104,fVar9 + fVar11);
  rf_gfx_end();
  rf_gfx_disable_texture();
  return;
}

Assistant:

RF_API void rf_draw_billboard_rec(rf_camera3d camera, rf_texture2d texture, rf_rec source_rec, rf_vec3 center, float size, rf_color tint)
{
    // NOTE: Billboard size will maintain source_rec aspect ratio, size will represent billboard width
    rf_vec2 size_ratio = {size, size * (float)source_rec.height / source_rec.width };

    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_vec3 right = {mat_view.m0, mat_view.m4, mat_view.m8 };
    //rf_vec3 up = { mat_view.m1, mat_view.m5, mat_view.m9 };

    // NOTE: Billboard locked on axis-Y
    rf_vec3 up = {0.0f, 1.0f, 0.0f };
    /*
        a-------b
        |       |
        |   *   |
        |       |
        d-------c
    */
    right = rf_vec3_scale(right, size_ratio.x / 2);
    up = rf_vec3_scale(up, size_ratio.y / 2);

    rf_vec3 p1 = rf_vec3_add(right, up);
    rf_vec3 p2 = rf_vec3_sub(right, up);

    rf_vec3 a = rf_vec3_sub(center, p2);
    rf_vec3 b = rf_vec3_add(center, p1);
    rf_vec3 c = rf_vec3_add(center, p2);
    rf_vec3 d = rf_vec3_sub(center, p1);

    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();

    rf_gfx_enable_texture(texture.id);

    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(tint.r, tint.g, tint.b, tint.a);

    // Bottom-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(a.x, a.y, a.z);

    // Top-left corner for texture and quad
    rf_gfx_tex_coord2f((float)source_rec.x/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(d.x, d.y, d.z);

    // Top-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)(source_rec.y + source_rec.height)/texture.height);
    rf_gfx_vertex3f(c.x, c.y, c.z);

    // Bottom-right corner for texture and quad
    rf_gfx_tex_coord2f((float)(source_rec.x + source_rec.width)/texture.width, (float)source_rec.y/texture.height);
    rf_gfx_vertex3f(b.x, b.y, b.z);
    rf_gfx_end();

    rf_gfx_disable_texture();
}